

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GetNameTest.cpp
# Opt level: O3

int __thiscall
GetNameTest::SubmitRecord(GetNameTest *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = SubmitName(this,packet,length,start);
  uVar2 = length;
  if ((iVar1 + 10U <= length) &&
     (uVar2 = iVar1 + 10U + (uint)CONCAT11(packet[iVar1 + 8],packet[iVar1 + 9]), length <= uVar2)) {
    uVar2 = length;
  }
  return uVar2;
}

Assistant:

int GetNameTest::SubmitRecord(uint8_t * packet, uint32_t length, uint32_t start)
{
    int ldata = 0;

    /* Labels are only tabulated in responses, to avoid polluting data with erroneous packets */
    start = SubmitName(packet, length, start);

    if ((start + 10) > length)
    {
        start = length;
    }
    else
    {
        ldata = (packet[start + 8] << 8) | packet[start + 9];

        if (start + ldata + 10 > length)
        {
            start = length;
        }
        else
        {
            start += ldata + 10;
        }
    }

    return start;
}